

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O1

void RC2_decrypt(ulong *data,RC2_KEY *key)

{
  ushort *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar3 = (uint)*data;
  uVar11 = *(uint *)((long)data + 4);
  uVar6 = uVar3 >> 0x10;
  uVar8 = uVar11 >> 0x10;
  puVar1 = (ushort *)((long)key->data + 0x7e);
  iVar5 = 5;
  iVar4 = 3;
  do {
    uVar2 = uVar3 & 0xffff;
    uVar10 = uVar11 & 0xffff;
    uVar9 = (uVar8 >> 5 | uVar8 << 0xb) - ((uint)*puVar1 + (uVar11 & uVar6) + (~uVar10 & uVar3));
    uVar8 = uVar9 & 0xffff;
    uVar11 = (uVar10 >> 3 | uVar10 << 0xd) - ((uint)puVar1[-1] + (uVar6 & uVar3) + (~uVar6 & uVar9))
    ;
    uVar6 = (uVar6 >> 2 | uVar6 << 0xe) - ((uint)puVar1[-2] + (uVar3 & uVar9) + (~uVar2 & uVar11));
    uVar3 = (uVar2 >> 1 | uVar2 << 0xf) - ((uint)puVar1[-3] + (uVar11 & uVar9) + (~uVar8 & uVar6));
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        *(uint *)data = (uVar6 & 0xffff) << 0x10 | uVar3 & 0xffff;
        *(uint *)((long)data + 4) = uVar11 & 0xffff | uVar8 << 0x10;
        return;
      }
      iVar5 = (iVar4 == 2) + 5;
      uVar7 = (short)uVar9 - *(short *)((long)key->data + (ulong)(uVar11 & 0x3f) * 2);
      uVar8 = (uint)uVar7;
      uVar11 = (uVar11 & 0xffff) - (uint)*(ushort *)((long)key->data + (ulong)(uVar6 & 0x3f) * 2);
      uVar6 = (uVar6 & 0xffff) - (uint)*(ushort *)((long)key->data + (ulong)(uVar3 & 0x3f) * 2);
      uVar3 = uVar3 - *(ushort *)((long)key->data + (ulong)(uVar7 & 0x3f) * 2);
    }
    uVar6 = uVar6 & 0xffff;
    puVar1 = puVar1 + -4;
  } while( true );
}

Assistant:

static void RC2_decrypt(uint32_t *d, RC2_KEY *key) {
  int i, n;
  uint16_t *p0, *p1;
  uint16_t x0, x1, x2, x3, t;
  uint32_t l;

  l = d[0];
  x0 = (uint16_t)l & 0xffff;
  x1 = (uint16_t)(l >> 16L);
  l = d[1];
  x2 = (uint16_t)l & 0xffff;
  x3 = (uint16_t)(l >> 16L);

  n = 3;
  i = 5;

  p0 = &key->data[63];
  p1 = &key->data[0];
  for (;;) {
    t = ((x3 << 11) | (x3 >> 5)) & 0xffff;
    x3 = (t - (x0 & ~x2) - (x1 & x2) - *(p0--)) & 0xffff;
    t = ((x2 << 13) | (x2 >> 3)) & 0xffff;
    x2 = (t - (x3 & ~x1) - (x0 & x1) - *(p0--)) & 0xffff;
    t = ((x1 << 14) | (x1 >> 2)) & 0xffff;
    x1 = (t - (x2 & ~x0) - (x3 & x0) - *(p0--)) & 0xffff;
    t = ((x0 << 15) | (x0 >> 1)) & 0xffff;
    x0 = (t - (x1 & ~x3) - (x2 & x3) - *(p0--)) & 0xffff;

    if (--i == 0) {
      if (--n == 0) {
        break;
      }
      i = (n == 2) ? 6 : 5;

      x3 = (x3 - p1[x2 & 0x3f]) & 0xffff;
      x2 = (x2 - p1[x1 & 0x3f]) & 0xffff;
      x1 = (x1 - p1[x0 & 0x3f]) & 0xffff;
      x0 = (x0 - p1[x3 & 0x3f]) & 0xffff;
    }
  }

  d[0] = (uint32_t)(x0 & 0xffff) | ((uint32_t)(x1 & 0xffff) << 16L);
  d[1] = (uint32_t)(x2 & 0xffff) | ((uint32_t)(x3 & 0xffff) << 16L);
}